

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateSerializationConditional
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType type;
  JavaType java_type;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  bVar1 = Params::use_reference_types_for_primitives((this->super_FieldGenerator).params_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"if (this.$name$ != null) {\n");
  }
  else {
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,"if (has$capitalized_name$ || ");
    }
    else {
      io::Printer::Print(printer,&this->variables_,"if (");
    }
    type = GetJavaType(this->descriptor_);
    bVar1 = anon_unknown_5::IsArrayType(type);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "!java.util.Arrays.equals(this.$name$, $default$)) {\n");
    }
    else {
      bVar1 = anon_unknown_5::IsReferenceType(type);
      if (bVar1) {
        io::Printer::Print(printer,&this->variables_,"!this.$name$.equals($default$)) {\n");
      }
      else if (type == JAVATYPE_FLOAT) {
        io::Printer::Print(printer,&this->variables_,
                           "java.lang.Float.floatToIntBits(this.$name$)\n    != java.lang.Float.floatToIntBits($default$)) {\n"
                          );
      }
      else if (type == JAVATYPE_DOUBLE) {
        io::Printer::Print(printer,&this->variables_,
                           "java.lang.Double.doubleToLongBits(this.$name$)\n    != java.lang.Double.doubleToLongBits($default$)) {\n"
                          );
      }
      else {
        io::Printer::Print(printer,&this->variables_,"this.$name$ != $default$) {\n");
      }
    }
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateSerializationConditional(io::Printer* printer) const {
  if (params_.use_reference_types_for_primitives()) {
    // For reference type mode, serialize based on equality
    // to null.
    printer->Print(variables_,
      "if (this.$name$ != null) {\n");
    return;
  }
  if (params_.generate_has()) {
    printer->Print(variables_,
      "if (has$capitalized_name$ || ");
  } else {
    printer->Print(variables_,
      "if (");
  }
  JavaType java_type = GetJavaType(descriptor_);
  if (IsArrayType(java_type)) {
    printer->Print(variables_,
      "!java.util.Arrays.equals(this.$name$, $default$)) {\n");
  } else if (IsReferenceType(java_type)) {
    printer->Print(variables_,
      "!this.$name$.equals($default$)) {\n");
  } else if (java_type == JAVATYPE_FLOAT) {
    printer->Print(variables_,
      "java.lang.Float.floatToIntBits(this.$name$)\n"
      "    != java.lang.Float.floatToIntBits($default$)) {\n");
  } else if (java_type == JAVATYPE_DOUBLE) {
    printer->Print(variables_,
      "java.lang.Double.doubleToLongBits(this.$name$)\n"
      "    != java.lang.Double.doubleToLongBits($default$)) {\n");
  } else {
    printer->Print(variables_,
      "this.$name$ != $default$) {\n");
  }
}